

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-magic.c
# Opt level: O1

wchar_t borg_spell_fail_rate(borg_spells spell)

{
  int iVar1;
  _Bool _Var2;
  wchar_t wVar3;
  uint uVar4;
  int iVar5;
  wchar_t wVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  borg_spells *pbVar10;
  
  uVar4 = 0xffffffff;
  if ((borg_magics != (borg_magic *)0x0) &&
     (lVar7 = (long)(player->class->magic).total_spells, 0 < lVar7)) {
    pbVar10 = &borg_magics->spell_enum;
    lVar9 = 0;
    do {
      if (*pbVar10 == spell) {
        uVar4 = (uint)lVar9;
        break;
      }
      lVar9 = lVar9 + 1;
      pbVar10 = pbVar10 + 8;
    } while (lVar7 != lVar9);
  }
  if ((int)uVar4 < 0) {
    wVar3 = L'd';
  }
  else {
    iVar8 = borg.trait[0x22];
    iVar5 = ((uint)borg_magics[uVar4].sfail - borg.trait[0x21]) +
            (borg.trait[0x23] - (uint)borg_magics[uVar4].level) * -3;
    iVar1 = iVar5 + 0x14;
    if (borg.trait[0x71] == 0) {
      iVar1 = iVar5;
    }
    _Var2 = flag_has_dbg((player->state).pflags,3,4,"player->state.pflags","(PF_ZERO_FAIL)");
    iVar5 = 5;
    if (5 < iVar8) {
      iVar5 = iVar8;
    }
    if (_Var2) {
      iVar5 = iVar8;
    }
    iVar8 = iVar1;
    if ((borg.trait[0x19] == 4) &&
       (iVar8 = iVar1 + 0x19, (borg_grids[borg.c.y][borg.c.x].info & 0x10) == 0)) {
      iVar8 = iVar1;
    }
    if (iVar5 < iVar8) {
      iVar5 = iVar8;
    }
    iVar8 = 0x32;
    if (iVar5 < 0x32) {
      iVar8 = iVar5;
    }
    iVar1 = iVar8 + 0x19;
    if (borg.trait[0x76] == 0) {
      iVar1 = iVar8;
    }
    iVar8 = iVar1 + 0xf;
    if (borg.trait[0x75] == 0) {
      iVar8 = iVar1;
    }
    wVar6 = iVar8 << (borg.trait[0x79] != 0);
    wVar3 = L'_';
    if (wVar6 < L'_') {
      wVar3 = wVar6;
    }
  }
  return wVar3;
}

Assistant:

int borg_spell_fail_rate(const enum borg_spells spell)
{
    int chance, minfail;

    int spell_num = borg_get_spell_number(spell);
    if (spell_num < 0)
        return 100;

    borg_magic *as = &borg_magics[spell_num];

    /* Access the spell  */
    chance = as->sfail;

    /* Reduce failure rate by "effective" level adjustment */
    chance -= 3 * (borg.trait[BI_CLEVEL] - as->level);

    /* Reduce failure rate by stat adjustment */
    chance -= borg.trait[BI_FAIL1];

    /* Fear makes the failrate higher */
    if (borg.trait[BI_ISAFRAID])
        chance += 20;

    /* Extract the minimum failure rate */
    minfail = borg.trait[BI_FAIL2];

    /* Non mage characters never get too good */
    if (!player_has(player, PF_ZERO_FAIL)) {
        if (minfail < 5)
            minfail = 5;
    }

    /* Necromancers are punished by being on lit squares */
    /* necromancers like the dark */
    if (borg.trait[BI_CLASS] == CLASS_NECROMANCER &&
        borg_grids[borg.c.y][borg.c.x].info & BORG_LIGHT) {
        chance += 25;

    }

    /* Minimum failure rate and max */
    if (chance < minfail)
        chance = minfail;
    if (chance > 50)
        chance = 50;

    /* Stunning makes spells harder */
    if (borg.trait[BI_ISHEAVYSTUN])
        chance += 25;
    if (borg.trait[BI_ISSTUN])
        chance += 15;

    /* Amnesia makes it harder */
    if (borg.trait[BI_ISFORGET])
        chance *= 2;

    /* Always a 5 percent chance of working */
    if (chance > 95)
        chance = 95;

    /* Return the chance */
    return (chance);
}